

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O3

Vec_Int_t * Acec_RewriteTop(Gia_Man_t *p,Acec_Box_t *pBox)

{
  Vec_Int_t *p_00;
  int *piVar1;
  Vec_Wec_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int **ppiVar9;
  uint uVar10;
  uint uVar11;
  int Out [2];
  int In [3];
  int local_48;
  int local_44;
  int local_40 [4];
  
  pVVar3 = p->vCos;
  uVar11 = pVVar3->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < uVar11) {
    iVar4 = uVar11 + 1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar1;
  if (0 < (int)uVar11) {
    iVar4 = *pVVar3->pArray;
    if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pVVar2 = pBox->vRootLits;
    uVar6 = pVVar2->nSize;
    if ((int)uVar6 < 1) {
      uVar8 = 0;
    }
    else {
      ppiVar9 = &pVVar2->pArray->pArray;
      uVar8 = 0;
      do {
        if (*(int *)((long)ppiVar9 + -4) < 1) goto LAB_00662b13;
        if (**ppiVar9 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if ((uint)**ppiVar9 >> 1 == iVar4 - (*(uint *)(p->pObjs + iVar4) & 0x1fffffff))
        goto LAB_006628f5;
        uVar8 = uVar8 + 1;
        ppiVar9 = ppiVar9 + 2;
      } while (uVar6 != uVar8);
      uVar8 = (ulong)uVar6;
    }
LAB_006628f5:
    if ((int)uVar11 <= (int)uVar8) {
      __assert_fail("iStart < Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                    ,0x167,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
    }
    iVar4 = 0;
    uVar10 = 0;
    if ((int)uVar8 < (int)uVar6) {
      uVar8 = uVar8 & 0xffffffff;
      uVar10 = 0;
      do {
        pVVar3 = pVVar2->pArray;
        local_40[2] = 0;
        local_40[0] = 0;
        local_40[1] = 0;
        uVar11 = pVVar3[uVar8].nSize;
        if ((int)uVar11 < 1) {
          __assert_fail("Vec_IntSize(vLevel) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                        ,0x16c,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
        }
        if (3 < uVar11) {
          __assert_fail("Vec_IntSize(vLevel) <= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                        ,0x16d,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
        }
        piVar1 = pVVar3[uVar8].pArray;
        if (uVar11 == 1) {
          Vec_IntPush(p_00,*piVar1);
        }
        else {
          lVar7 = 0;
          do {
            local_40[lVar7] = piVar1[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 < pVVar3[uVar8].nSize);
          Acec_InsertFadd(p,local_40,&local_48);
          Vec_IntPush(p_00,local_48);
          pVVar2 = pBox->vRootLits;
          uVar11 = pVVar2->nSize;
          if ((int)(uVar8 + 1) < (int)uVar11) {
            pVVar3 = pVVar2->pArray + uVar8 + 1;
          }
          else {
            if (uVar11 == pVVar2->nCap) {
              if ((int)uVar11 < 0x10) {
                if (pVVar2->pArray == (Vec_Int_t *)0x0) {
                  pVVar3 = (Vec_Int_t *)malloc(0x100);
                }
                else {
                  pVVar3 = (Vec_Int_t *)realloc(pVVar2->pArray,0x100);
                  uVar11 = pVVar2->nCap;
                }
                pVVar2->pArray = pVVar3;
                iVar5 = 0x10 - uVar11;
                pVVar3 = pVVar3 + (int)uVar11;
                iVar4 = 0x10;
              }
              else {
                if (pVVar2->pArray == (Vec_Int_t *)0x0) {
                  pVVar3 = (Vec_Int_t *)malloc((ulong)uVar11 << 5);
                  uVar6 = uVar11;
                }
                else {
                  pVVar3 = (Vec_Int_t *)realloc(pVVar2->pArray,(ulong)uVar11 << 5);
                  uVar6 = pVVar2->nCap;
                }
                iVar4 = uVar11 * 2;
                pVVar2->pArray = pVVar3;
                iVar5 = iVar4 - uVar6;
                pVVar3 = pVVar3 + (int)uVar6;
              }
              memset(pVVar3,0,(long)iVar5 << 4);
              pVVar2->nCap = iVar4;
              uVar11 = pVVar2->nSize;
            }
            pVVar2->nSize = uVar11 + 1;
            if ((int)uVar11 < 0) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                            ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
            }
            pVVar3 = pVVar2->pArray + ((ulong)(uVar11 + 1) - 1);
          }
          Vec_IntPush(pVVar3,local_44);
          uVar10 = uVar10 + 1;
        }
        uVar8 = uVar8 + 1;
        pVVar2 = pBox->vRootLits;
      } while ((int)uVar8 < pVVar2->nSize);
      iVar4 = p_00->nSize;
      uVar11 = p->vCos->nSize;
    }
    if ((int)uVar11 <= iVar4) {
      p_00->nSize = uVar11;
      printf("Added %d adders for replace CLAs.  ",(ulong)uVar10);
      return p_00;
    }
    __assert_fail("Vec_IntSize(vRes) >= Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                  ,0x17d,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
  }
LAB_00662b13:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Acec_RewriteTop( Gia_Man_t * p, Acec_Box_t * pBox )
{
    Vec_Int_t * vRes = Vec_IntAlloc( Gia_ManCoNum(p) + 1 );
    Vec_Int_t * vLevel;
    int i, k, iStart, iLit, Driver, Count = 0;
    // determine how much to shift
    Driver = Gia_ObjFaninId0p( p, Gia_ManCo(p, 0) );
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, iStart )
        if ( Abc_Lit2Var(Vec_IntEntry(vLevel,0)) == Driver )
            break;
    assert( iStart < Gia_ManCoNum(p) );
    //Vec_WecPrintLits( pBox->vRootLits );
    Vec_WecForEachLevelStart( pBox->vRootLits, vLevel, i, iStart )
    {
        int In[3] = {0}, Out[2];
        assert( Vec_IntSize(vLevel) > 0 );
        assert( Vec_IntSize(vLevel) <= 3 );
        if ( Vec_IntSize(vLevel) == 1 )
        {
            Vec_IntPush( vRes, Vec_IntEntry(vLevel, 0) );
            continue;
        }
        Vec_IntForEachEntry( vLevel, iLit, k )
            In[k] = iLit;
        Acec_InsertFadd( p, In, Out );
        Vec_IntPush( vRes, Out[0] );
        if ( i+1 < Vec_WecSize(pBox->vRootLits) )
            Vec_IntPush( Vec_WecEntry(pBox->vRootLits, i+1), Out[1] );
        else
            Vec_IntPush( Vec_WecPushLevel(pBox->vRootLits), Out[1] );
        Count++;
    }
    assert( Vec_IntSize(vRes) >= Gia_ManCoNum(p) );
    Vec_IntShrink( vRes, Gia_ManCoNum(p) );
    printf( "Added %d adders for replace CLAs.  ", Count );
    return vRes;
}